

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::blitStencilToColor2D
               (RenderContext *renderCtx,deUint32 srcTex,int width,int height)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  TestError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  deUint8 indices [6];
  float texCoord [8];
  float positions [8];
  VertexArrayBinding vertexArrays [2];
  ShaderProgram program;
  undefined1 local_2a8 [8];
  undefined1 local_2a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined4 local_280;
  long *local_278;
  long local_270;
  long local_268 [2];
  int local_254;
  int local_250;
  deUint32 local_24c;
  undefined1 local_248 [32];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [2];
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  undefined1 local_1d8 [8];
  _Alloc_hider local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  pointer local_190;
  PrimitiveType local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  pointer pbStack_150;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [40];
  ShaderProgram local_100;
  
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  local_250 = width;
  local_24c = srcTex;
  memset(local_1d8,0,0xac);
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_texCoord;\nout highp vec2 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
             ,"");
  local_2a8 = (undefined1  [8])((ulong)(uint)local_2a8._4_4_ << 0x20);
  local_2a0._0_8_ = &local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,local_248._0_8_,
             (pointer)(local_248._0_8_ + CONCAT44(local_248._12_4_,local_248._8_4_)));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + ((ulong)local_2a8 & 0xffffffff) * 0x18),(value_type *)local_2a0);
  local_278 = local_268;
  local_254 = height;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,
             "#version 300 es\nuniform highp usampler2D u_sampler;\nin highp vec2 v_texCoord;\nlayout(location = 0) out highp uint o_stencil;\nvoid main (void)\n{\n\to_stencil = texture(u_sampler, v_texCoord).x;\n}\n"
             ,"");
  local_228._0_4_ = 1;
  local_228._8_8_ = local_218[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_228 + 8),local_278,local_270 + (long)local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + (local_228._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_228 + 8));
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_1d8);
  if ((char *)local_228._8_8_ != local_218[0]._M_local_buf + 8) {
    operator_delete((void *)local_228._8_8_,local_218[0]._8_8_ + 1);
  }
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._0_8_ != &local_290) {
    operator_delete((void *)local_2a0._0_8_,local_290._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar6 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + lVar6));
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  local_218[0]._M_allocated_capacity = 0x3f800000bf800000;
  local_218[0]._8_8_ = 0x3f8000003f800000;
  local_228._0_8_ = (pointer)0xbf800000bf800000;
  local_228._8_8_ = 0xbf8000003f800000;
  local_248._16_8_ = 0x3f80000000000000;
  local_248._24_8_ = 0x3f8000003f800000;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_4_ = 0x3f800000;
  local_248._12_4_ = 0;
  local_278 = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"a_position","");
  local_2a8._0_4_ = 1;
  local_2a0._0_8_ = &local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,local_278,local_270 + (long)local_278);
  local_280 = 0;
  local_1d8._0_4_ = local_2a8._0_4_;
  local_1d0._M_p = (pointer)&local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_2a0._0_8_,(char *)(local_2a0._0_8_ + local_2a0._8_8_));
  local_1c0.field_2._M_allocated_capacity._0_4_ = local_280;
  local_1c0.field_2._8_4_ = 8;
  local_1c0.field_2._12_4_ = 0;
  iStack_1a0 = 2;
  iStack_19c = 4;
  local_198 = 0;
  local_190 = (pointer)local_228;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._0_8_ != &local_290) {
    operator_delete((void *)local_2a0._0_8_,local_290._M_allocated_capacity + 1);
  }
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"a_texCoord","");
  local_2a8._0_4_ = 1;
  local_2a0._0_8_ = &local_290;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,local_1f8,local_1f0 + (long)local_1f8);
  local_280 = 0;
  local_188 = local_2a8._0_4_;
  pbVar5 = &local_170;
  local_180[0] = pbVar5;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_180,local_2a0._0_8_,(char *)(local_2a0._0_8_ + local_2a0._8_8_));
  local_170.field_2._M_allocated_capacity._0_4_ = local_280;
  local_170.field_2._8_8_ = (pointer)0x8;
  pbStack_150 = (pointer)0x400000002;
  local_148.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_148.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_248;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._0_8_ != &local_290) {
    operator_delete((void *)local_2a0._0_8_,local_290._M_allocated_capacity + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_278 != local_268) {
    operator_delete(local_278,local_268[0] + 1);
  }
  local_278 = (long *)CONCAT26(local_278._6_2_,0x30100000000);
  local_278 = (long *)CONCAT44(local_278._4_4_,0x2020100);
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar6 = CONCAT44(extraout_var,iVar2);
  if (local_100.m_program.m_info.linkOk != false) {
    (**(code **)(lVar6 + 8))(0x84c0);
    (**(code **)(lVar6 + 0xb8))(0xde1,local_24c);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2600);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x90ea,0x1901);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Texture state setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0xfd);
    (**(code **)(lVar6 + 0x1680))(local_100.m_program.m_program);
    pcVar1 = *(code **)(lVar6 + 0x14f0);
    uVar4 = (**(code **)(lVar6 + 0xb48))(local_100.m_program.m_program,"u_sampler");
    (*pcVar1)(uVar4,0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Program setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x101);
    (**(code **)(lVar6 + 0x1a00))(0,0,local_250,local_254);
    local_2a8 = (undefined1  [8])0x600000000;
    local_2a0._0_8_ = local_2a0._0_8_ & 0xffffffff00000000;
    local_2a0._8_8_ = (string *)&local_278;
    glu::draw(renderCtx,local_100.m_program.m_program,2,(VertexArrayBinding *)local_1d8,
              (PrimitiveList *)local_2a8,(DrawUtilCallback *)0x0);
    lVar6 = -0xa0;
    do {
      if (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    pbVar5[-1].field_2._M_allocated_capacity) {
        operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        pbVar5[-1].field_2._M_allocated_capacity,
                        (ulong)((pbVar5->_M_dataplus)._M_p + 1));
      }
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pbVar5[-3].field_2;
      lVar6 = lVar6 + 0x50;
    } while (lVar6 != 0);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  local_2a8 = (undefined1  [8])(local_2a0 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Compile failed","");
  tcu::TestError::TestError(this,(string *)local_2a8);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void blitStencilToColor2D (const glu::RenderContext& renderCtx, deUint32 srcTex, int width, int height)
{
	const glu::ShaderProgram program(renderCtx, glu::ProgramSources()
		<< glu::VertexSource(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"in highp vec2 a_texCoord;\n"
			"out highp vec2 v_texCoord;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"	v_texCoord = a_texCoord;\n"
			"}\n")
		<< glu::FragmentSource(
			"#version 300 es\n"
			"uniform highp usampler2D u_sampler;\n"
			"in highp vec2 v_texCoord;\n"
			"layout(location = 0) out highp uint o_stencil;\n"
			"void main (void)\n"
			"{\n"
			"	o_stencil = texture(u_sampler, v_texCoord).x;\n"
			"}\n"));

	const float positions[] =
	{
		-1.0f, -1.0f,
		+1.0f, -1.0f,
		-1.0f, +1.0f,
		+1.0f, +1.0f
	};
	const float texCoord[] =
	{
		0.0f, 0.0f,
		1.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 1.0f
	};
	const glu::VertexArrayBinding vertexArrays[] =
	{
		glu::va::Float("a_position", 2, 4, 0, &positions[0]),
		glu::va::Float("a_texCoord", 2, 4, 0, &texCoord[0])
	};
	const deUint8 indices[] = { 0, 1, 2, 2, 1, 3 };

	const glw::Functions& gl = renderCtx.getFunctions();

	if (!program.isOk())
		throw tcu::TestError("Compile failed");

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, srcTex);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, GL_STENCIL_INDEX);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture state setup failed");

	gl.useProgram(program.getProgram());
	gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_sampler"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program setup failed");

	gl.viewport(0, 0, width, height);
	glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
}